

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pb.cpp
# Opt level: O3

void poisbinom(double *p_value_poisbinom,int *I1_l,int *I2_l,int n,int m,uint g)

{
  size_t __n;
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  long *plVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int k;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  
  uVar16 = (ulong)(uint)m;
  uVar17 = (ulong)(n + 1);
  uVar12 = uVar17 * 8;
  if (n < -1) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar12);
  uVar12 = (ulong)(m + 1);
  __n = uVar12 * 8;
  if (-1 < n) {
    uVar13 = 0xffffffffffffffff;
    if (-2 < m) {
      uVar13 = __n;
    }
    uVar15 = 0;
    do {
      pvVar6 = operator_new__(uVar13);
      *(void **)((long)pvVar5 + uVar15 * 8) = pvVar6;
      uVar15 = uVar15 + 1;
    } while (uVar17 != uVar15);
  }
  uVar13 = 0xffffffffffffffff;
  if (-2 < m) {
    uVar13 = __n;
  }
  pvVar6 = operator_new__(uVar13);
  if (0 < m) {
    uVar15 = 1;
    do {
      dVar18 = 1.0;
      if (0 < n) {
        iVar1 = I2_l[uVar15];
        uVar10 = 1;
        dVar18 = 1.0;
        do {
          iVar2 = I1_l[uVar10];
          iVar4 = iVar2;
          if (iVar1 < iVar2) {
            iVar4 = iVar1;
          }
          if (iVar4 < 1) {
            dVar19 = 0.0;
          }
          else {
            dVar19 = (double)(iVar2 + iVar1 + -1);
          }
          *(double *)(*(long *)((long)pvVar5 + uVar10 * 8) + uVar15 * 8) = dVar19 / (double)g;
          dVar18 = dVar18 * (1.0 - dVar19 / (double)g);
          uVar10 = uVar10 + 1;
        } while (uVar17 != uVar10);
      }
      *(double *)((long)pvVar6 + uVar15 * 8) = 1.0 - dVar18;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar12);
  }
  plVar7 = (long *)operator_new__(uVar13);
  if (-1 < m) {
    uVar15 = 0;
    do {
      pvVar8 = operator_new__(uVar13);
      plVar7[uVar15] = (long)pvVar8;
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
    if (-1 < m) {
      lVar9 = 0;
      uVar15 = 0;
      pvVar8 = pvVar6;
      do {
        lVar14 = 0;
        do {
          if ((int)uVar15 + (int)lVar14 == 0 && (int)uVar15 == 0) {
            *(undefined8 *)*plVar7 = 0x3ff0000000000000;
          }
          else if (uVar15 == 0) {
            *(double *)(*plVar7 + lVar9 + lVar14 * 8) =
                 (1.0 - *(double *)((long)pvVar8 + lVar14 * 8)) *
                 *(double *)(*plVar7 + lVar9 + -8 + lVar14 * 8);
          }
          else if (lVar14 == 0) {
            *(double *)(plVar7[uVar15] + uVar15 * 8) =
                 *(double *)(plVar7[uVar15 - 1] + -8 + uVar15 * 8) *
                 *(double *)((long)pvVar6 + uVar15 * 8);
          }
          else {
            dVar18 = *(double *)((long)pvVar8 + lVar14 * 8);
            *(double *)(plVar7[uVar15] + lVar9 + lVar14 * 8) =
                 (1.0 - dVar18) * *(double *)(plVar7[uVar15] + lVar9 + -8 + lVar14 * 8) +
                 dVar18 * *(double *)(plVar7[uVar15 - 1] + lVar9 + -8 + lVar14 * 8);
          }
          lVar14 = lVar14 + 1;
        } while ((uVar15 - uVar12) + lVar14 != 0);
        uVar15 = uVar15 + 1;
        lVar9 = lVar9 + 8;
        pvVar8 = (void *)((long)pvVar8 + 8);
      } while (uVar15 != uVar12);
      pvVar8 = operator_new__(uVar13);
      if (-1 < m) {
        lVar9 = uVar16 * 8 + 8;
        lVar14 = 0;
        do {
          lVar11 = lVar14 + -1;
          if (lVar14 == 0) {
            *(undefined8 *)((long)pvVar8 + uVar16 * 8) =
                 *(undefined8 *)(plVar7[uVar16] + uVar16 * 8);
          }
          else {
            *(double *)((long)pvVar8 + lVar11 * 8 + lVar9) =
                 *(double *)((long)pvVar8 + lVar14 * 8 + lVar9) +
                 *(double *)(plVar7[uVar16 + lVar14] + uVar16 * 8);
          }
          lVar14 = lVar11;
        } while (-lVar11 != uVar12);
        if (-1 < m) {
          memcpy(p_value_poisbinom,pvVar8,__n);
          uVar16 = 0;
          do {
            if ((void *)plVar7[uVar16] != (void *)0x0) {
              operator_delete__((void *)plVar7[uVar16]);
            }
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
      }
      goto LAB_00107bdc;
    }
  }
  pvVar8 = operator_new__(uVar13);
LAB_00107bdc:
  if (-1 < n) {
    uVar12 = 0;
    do {
      pvVar3 = *(void **)((long)pvVar5 + uVar12 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
  }
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  operator_delete__(plVar7);
  operator_delete__(pvVar8);
  return;
}

Assistant:

void poisbinom(double* p_value_poisbinom, int* I1_l, int* I2_l, int n, int m, unsigned int g)
{
    double** q = new double* [n+1];
    for(int i=0; i<n+1; i++)
        q[i] = new double [m+1];
    double prod;
    double* p = new double [m+1];
    for(int j=1; j<=m; j++){
        int z = ceil(double(I2_l[j])/2);
        z = 1;
        prod = 1;
        for(int i=1; i<=n; i++){
            q[i][j] = 0;
            if (z<=min(I1_l[i], I2_l[j]))
                q[i][j] = I1_l[i] + I2_l[j] - 2*z + 1;
            q[i][j] = q[i][j]/g;
            prod *= (1-q[i][j]);
        }
        p[j] = 1-prod;
    }

    double** x = new double* [m+1];
    for(int k=0; k<=m; k++)
       x[k] = new double [m+1];
    for(int k=0; k<=m; k++)
    {
       for(int j=k; j<=m; j++)
       {
            if(k==0 && j==0)
                x[k][j] = 1;
            else if(k==0)
                x[k][j] = x[k][j-1] * (1-p[j]);
            else if(k==j)
                x[k][j] = x[k-1][j-1] * (p[j]);
            else
            {
                x[k][j] = x[k][j-1] * (1-p[j]) + x[k-1][j-1] * (p[j]);
            }

       }
    }
    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++)
    {
        if (k==0)
        {
            CumSum[m] = x[m][m];
        }
        else CumSum[m-k] = CumSum[m-k+1] + x[m-k][m];
    }
    for(int k=0; k<=m; k++)
    {
        p_value_poisbinom[k] = CumSum[k];
    }

    for(int k=0; k<=m; k++)
    {
        delete [] x[k];
    }
    for(int i=0; i<n+1; i++)
        delete [] q[i];
    delete [] q;
    delete [] p;
    delete [] x;
    delete [] CumSum;
}